

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printBasisSGDInfo(ktx_uint8_t *bgd,ktx_uint64_t byteLength,ktx_uint32_t numImages)

{
  long lVar1;
  ktxBasisLzGlobalHeader *bgdh;
  
  if (0x13 < byteLength) {
    fprintf(_stdout,"endpointCount: %u\n",(ulong)*(ushort *)bgd);
    fprintf(_stdout,"selectorCount: %u\n",(ulong)*(ushort *)(bgd + 2));
    fprintf(_stdout,"endpointsByteLength: %u\n",(ulong)*(uint *)(bgd + 4));
    fprintf(_stdout,"selectorsByteLength: %u\n",(ulong)*(uint *)(bgd + 8));
    fprintf(_stdout,"tablesByteLength: %u\n",(ulong)*(uint *)(bgd + 0xc));
    fprintf(_stdout,"extendedByteLength: %u\n",(ulong)*(uint *)(bgd + 0x10));
    for (lVar1 = 0; ((ulong)numImages * 0x14 - lVar1 != 0 && (lVar1 + 0x28U <= byteLength));
        lVar1 = lVar1 + 0x14) {
      fprintf(_stdout,"\nimageFlags: %#x\n",(ulong)*(uint *)(bgd + lVar1 + 0x14));
      fprintf(_stdout,"rgbSliceByteLength: %u\n",(ulong)*(uint *)(bgd + lVar1 + 0x1c));
      fprintf(_stdout,"rgbSliceByteOffset: %#x\n",(ulong)*(uint *)(bgd + lVar1 + 0x18));
      fprintf(_stdout,"alphaSliceByteLength: %u\n",(ulong)*(uint *)(bgd + lVar1 + 0x24));
      fprintf(_stdout,"alphaSliceByteOffset: %#x\n",(ulong)*(uint *)(bgd + lVar1 + 0x20));
    }
  }
  return;
}

Assistant:

void
printBasisSGDInfo(ktx_uint8_t* bgd, ktx_uint64_t byteLength,
                ktx_uint32_t numImages)
{
    ktxBasisLzGlobalHeader* bgdh = (ktxBasisLzGlobalHeader*)(bgd);
    if (byteLength < sizeof(ktxBasisLzGlobalHeader))
        return;

    fprintf(stdout, "endpointCount: %u\n", bgdh->endpointCount);
    fprintf(stdout, "selectorCount: %u\n", bgdh->selectorCount);
    fprintf(stdout, "endpointsByteLength: %u\n", bgdh->endpointsByteLength);
    fprintf(stdout, "selectorsByteLength: %u\n", bgdh->selectorsByteLength);
    fprintf(stdout, "tablesByteLength: %u\n", bgdh->tablesByteLength);
    fprintf(stdout, "extendedByteLength: %u\n", bgdh->extendedByteLength);

    ktxBasisLzEtc1sImageDesc* slices = (ktxBasisLzEtc1sImageDesc*)(bgd + sizeof(ktxBasisLzGlobalHeader));
    for (ktx_uint32_t i = 0; i < numImages; i++) {
        if (byteLength < (i + 1) * sizeof(ktxBasisLzEtc1sImageDesc) + sizeof(ktxBasisLzGlobalHeader))
            break;

        fprintf(stdout, "\nimageFlags: %#x\n", slices[i].imageFlags);
        fprintf(stdout, "rgbSliceByteLength: %u\n", slices[i].rgbSliceByteLength);
        fprintf(stdout, "rgbSliceByteOffset: %#x\n", slices[i].rgbSliceByteOffset);
        fprintf(stdout, "alphaSliceByteLength: %u\n", slices[i].alphaSliceByteLength);
        fprintf(stdout, "alphaSliceByteOffset: %#x\n", slices[i].alphaSliceByteOffset);
    }
}